

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

void __thiscall QUrl::setQuery(QUrl *this,QUrlQuery *query)

{
  QUrlPrivate *pQVar1;
  Error *__ptr;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  pQVar1 = this->d;
  __ptr = (pQVar1->error)._M_t.
          super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
          super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
          super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  (pQVar1->error)._M_t.
  super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
  super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
  super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = (Error *)0x0;
  if (__ptr != (Error *)0x0) {
    std::default_delete<QUrlPrivate::Error>::operator()
              ((default_delete<QUrlPrivate::Error> *)&pQVar1->error,__ptr);
  }
  QUrlQuery::query(&local_38,query,(ComponentFormattingOptions)0x0);
  pQVar1 = this->d;
  data = &((pQVar1->query).d.d)->super_QArrayData;
  pcVar2 = (pQVar1->query).d.ptr;
  (pQVar1->query).d.d = local_38.d.d;
  (pQVar1->query).d.ptr = local_38.d.ptr;
  qVar3 = (pQVar1->query).d.size;
  (pQVar1->query).d.size = local_38.d.size;
  local_38.d.d = (Data *)data;
  local_38.d.ptr = pcVar2;
  local_38.d.size = qVar3;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  bVar4 = QUrlQuery::isEmpty(query);
  this->d->sectionIsPresent = !bVar4 << 6 | this->d->sectionIsPresent & 0xbf;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setQuery(const QUrlQuery &query)
{
    detach();
    d->clearError();

    // we know the data is in the right format
    d->query = query.toString();
    if (query.isEmpty())
        d->sectionIsPresent &= ~QUrlPrivate::Query;
    else
        d->sectionIsPresent |= QUrlPrivate::Query;
}